

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

void __thiscall Spi::flash_write_enable(Spi *this)

{
  byte bVar1;
  undefined8 in_RAX;
  undefined7 uStack_18;
  uint8_t data [1];
  
  bVar1 = this->verbose;
  _uStack_18 = in_RAX;
  if ((bool)bVar1 == true) {
    fwrite("status before enable:\n",0x16,1,_stdout);
    flash_read_status(this);
    bVar1 = this->verbose;
  }
  if ((bVar1 & 1) != 0) {
    fwrite("write enable..\n",0xf,1,_stdout);
  }
  _uStack_18 = CONCAT17(6,uStack_18);
  flash_chip_select(this);
  xfer_spi(this,data,1);
  flash_chip_deselect(this);
  if (this->verbose == true) {
    fwrite("status after enable:\n",0x15,1,_stdout);
    flash_read_status(this);
  }
  return;
}

Assistant:

void Spi::flash_write_enable() {
	if (verbose) {
		fprintf(stdout, "status before enable:\n");
		flash_read_status();
	}

	if (verbose)
		fprintf(stdout, "write enable..\n");

	uint8_t data[1] = { FC_WE };
	flash_chip_select();
	xfer_spi(data, 1);
	flash_chip_deselect();

	if (verbose) {
		fprintf(stdout, "status after enable:\n");
		flash_read_status();
	}
}